

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

void tinyformat::
     format<unsigned_int,unsigned_int,unsigned_int,unsigned_int,std::__cxx11::string,std::__cxx11::string>
               (ostream *out,char *fmt,uint *args,uint *args_1,uint *args_2,uint *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5)

{
  long in_FS_OFFSET;
  FormatArg local_a0;
  uint *local_88;
  code *local_80;
  code *local_78;
  uint *local_70;
  code *local_68;
  code *local_60;
  uint *local_58;
  code *local_50;
  code *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  code *local_38;
  code *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  code *local_20;
  code *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0.m_formatImpl = detail::FormatArg::formatImpl<unsigned_int>;
  local_a0.m_toIntImpl = detail::FormatArg::toIntImpl<unsigned_int>;
  local_80 = detail::FormatArg::formatImpl<unsigned_int>;
  local_78 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_68 = detail::FormatArg::formatImpl<unsigned_int>;
  local_60 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_50 = detail::FormatArg::formatImpl<unsigned_int>;
  local_48 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_40 = args_4;
  local_38 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_30 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_28 = args_5;
  local_20 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_18 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_a0.m_value = args;
  local_88 = args_1;
  local_70 = args_2;
  local_58 = args_3;
  detail::formatImpl(out,fmt,&local_a0,6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}